

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool parseCmakeBoolean(QJsonValue *value)

{
  int iVar1;
  storage_type_conflict *psVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QArrayDataPointer<char16_t> QStack_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = -0x5555555555555556;
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QJsonValue::toString();
  psVar2 = (storage_type_conflict *)QByteArrayView::lengthHelperCharArray("true",5);
  QVar4.m_data = psVar2;
  QVar4.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar4);
  iVar1 = QString::compare((QString *)&local_38,(CaseSensitivity)&local_50);
  bVar3 = true;
  if (iVar1 == 0) {
    psVar2 = (storage_type_conflict *)QByteArrayView::lengthHelperCharArray("on",3);
    QVar5.m_data = psVar2;
    QVar5.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar5);
    iVar1 = QString::compare((QString *)&local_38,(CaseSensitivity)&local_68);
    bVar3 = true;
    if (iVar1 == 0) {
      psVar2 = (storage_type_conflict *)QByteArrayView::lengthHelperCharArray("yes",4);
      QVar6.m_data = psVar2;
      QVar6.m_size = (qsizetype)&local_80;
      QString::fromUtf8(QVar6);
      iVar1 = QString::compare((QString *)&local_38,(CaseSensitivity)&local_80);
      bVar3 = true;
      if (iVar1 == 0) {
        psVar2 = (storage_type_conflict *)QByteArrayView::lengthHelperCharArray("y",2);
        QVar7.m_data = psVar2;
        QVar7.m_size = (qsizetype)&QStack_98;
        QString::fromUtf8(QVar7);
        iVar1 = QString::compare((QString *)&local_38,(CaseSensitivity)&QStack_98);
        bVar3 = true;
        if (iVar1 == 0) {
          iVar1 = QString::toInt((QString *)&local_38,(bool *)0x0,10);
          bVar3 = 0 < iVar1;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_98);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool parseCmakeBoolean(const QJsonValue &value)
{
    const QString stringValue = value.toString();
    return (stringValue.compare(QString::fromUtf8("true"), Qt::CaseInsensitive)
                 || stringValue.compare(QString::fromUtf8("on"), Qt::CaseInsensitive)
                 || stringValue.compare(QString::fromUtf8("yes"), Qt::CaseInsensitive)
                 || stringValue.compare(QString::fromUtf8("y"), Qt::CaseInsensitive)
                 || stringValue.toInt() > 0);
}